

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector5<HFSubConsumer_*,_PythonModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
::operator()(impl<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector5<HFSubConsumer_*,_PythonModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pfVar2;
  PyObject *result;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_fffffffffffffec8;
  arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed0;
  undefined1 local_113 [3];
  PyObject *local_110;
  arg_rvalue_from_python<unsigned_long> local_100;
  arg_rvalue_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined4 local_80;
  arg_rvalue_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  arg_lvalue_from_python_base local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(local_28);
  arg_from_python<PythonModuleClient_&>::arg_from_python
            ((arg_from_python<PythonModuleClient_&> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  bVar1 = converter::arg_lvalue_from_python_base::convertible(&local_30);
  if (bVar1) {
    get<1>(local_28);
    arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::arg_from_python(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar1 = converter::
            arg_rvalue_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::convertible(&local_78);
    if (bVar1) {
      get<2>(local_28);
      arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::arg_from_python(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      bVar1 = converter::
              arg_rvalue_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::convertible(&local_c8);
      if (bVar1) {
        get<3>(local_28);
        arg_from_python<unsigned_long>::arg_from_python
                  ((arg_from_python<unsigned_long> *)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8);
        bVar1 = converter::arg_rvalue_from_python<unsigned_long>::convertible(&local_100);
        if (bVar1) {
          compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
          ::second((compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                    *)0x3f8daa);
          bVar1 = default_call_policies::precall<_object*>(local_28);
          if (bVar1) {
            create_result_converter<_object*,boost::python::to_python_indirect<HFSubConsumer*,boost::python::detail::make_owning_holder>>
                      (local_18,(to_python_indirect<HFSubConsumer_*,_boost::python::detail::make_owning_holder>
                                 *)0x0);
            pfVar2 = compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                     ::first((compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                              *)0x3f8df9);
            local_110 = invoke<boost::python::to_python_indirect<HFSubConsumer*,boost::python::detail::make_owning_holder>,HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,unsigned_long),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<unsigned_long>>
                                  (local_113,pfVar2,&local_30,&local_78,&local_c8,&local_100);
            compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
            ::second((compressed_pair<HFSubConsumer_*(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>_>
                      *)0x3f8e42);
            local_8 = default_call_policies::postcall<_object*>(local_28,local_110);
          }
          else {
            local_8 = (PyObject *)0x0;
          }
        }
        else {
          local_8 = (PyObject *)0x0;
        }
        local_80 = 1;
        arg_from_python<unsigned_long>::~arg_from_python((arg_from_python<unsigned_long> *)0x3f8e73)
        ;
      }
      else {
        local_8 = (PyObject *)0x0;
        local_80 = 1;
      }
      arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~arg_from_python((arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x3f8e7d);
    }
    else {
      local_8 = (PyObject *)0x0;
      local_80 = 1;
    }
    arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~arg_from_python((arg_from_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x3f8e98);
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }